

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators-inl.h
# Opt level: O0

void __thiscall
spdlog::populators::logger_name_populator::populate
          (logger_name_populator *this,log_msg *msg,json *dest)

{
  pointer pfVar1;
  size_t sVar2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_00;
  undefined8 in_RSI;
  memory_buf_t tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  buffer<char> *this_01;
  allocator local_181;
  string local_180 [40];
  key_type *in_stack_fffffffffffffea8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffffeb0;
  allocator<char> local_139;
  buffer<char> local_138 [9];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffe40,(allocator<char> *)in_stack_fffffffffffffe38);
  std::allocator<char>::~allocator(&local_139);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x16036d);
  (*pfVar1->_vptr_formatter[2])(pfVar1,local_10,local_138);
  sVar2 = ::fmt::v8::detail::buffer<char>::size(local_138);
  if (sVar2 != 0) {
    this_01 = local_138;
    this_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)::fmt::v8::detail::buffer<char>::data(this_01);
    sVar2 = ::fmt::v8::detail::buffer<char>::size(this_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,(char *)this_00,sVar2,&local_181);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe40 =
         (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)
         nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         ::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(this_00,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)this_01);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffffe40);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
  }
  ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
            (in_stack_fffffffffffffe40);
  return;
}

Assistant:

SPDLOG_INLINE void logger_name_populator::populate(const details::log_msg &msg, nlohmann::json &dest)
{
    memory_buf_t tmp;
    pf_->format(msg, tmp);
    if (tmp.size() > 0) {
        dest[kKey] = std::string(tmp.data(), tmp.size());
    }
}